

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::Texture1DArrayView::sample(Texture1DArrayView *this,Sampler *sampler,float s,float t,float lod)

{
  WrapMode numLevels;
  ConstPixelBufferAccess *levels;
  int depth;
  Sampler *in_RDX;
  Vec4 VVar1;
  float lod_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  Texture1DArrayView *this_local;
  
  levels = *(ConstPixelBufferAccess **)&sampler->wrapR;
  numLevels = sampler->wrapS;
  depth = selectLayer((Texture1DArrayView *)sampler,t);
  VVar1 = sampleLevelArray1D((tcu *)this,levels,numLevels,in_RDX,s,depth,lod);
  return (Vec4)VVar1.m_data;
}

Assistant:

Vec4 Texture1DArrayView::sample (const Sampler& sampler, float s, float t, float lod) const
{
	return sampleLevelArray1D(m_levels, m_numLevels, sampler, s, selectLayer(t), lod);
}